

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int firLowpassFilter(StkFrames *src,StkFrames *dst,double stopband,double initial_value)

{
  StkFloat *pSVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int i;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  Convolution conv;
  double input [16384];
  double coeff [16384];
  undefined4 uStack_40088;
  undefined4 uStack_40084;
  Convolution CStack_40078;
  undefined8 uStack_40038;
  undefined4 auStack_40030 [32766];
  double adStack_20038 [16385];
  
  lVar12 = 0;
  do {
    dVar2 = (double)((int)lVar12 + -0x2000);
    dVar3 = cos((dVar2 * 0.0001220703125 + 1.0) * 3.141592653589793);
    dVar2 = dVar2 * stopband;
    dVar4 = 1.0;
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      dVar4 = sin(dVar2 * 3.141592653589793);
      dVar4 = dVar4 / (dVar2 * 3.141592653589793);
    }
    adStack_20038[lVar12] = (dVar3 * -0.46 + 0.54) * dVar4 * stopband;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x4000);
  Convolution::Convolution(&CStack_40078,0x4000,adStack_20038);
  uStack_40088 = SUB84(initial_value,0);
  uStack_40084 = (undefined4)((ulong)initial_value >> 0x20);
  lVar12 = 0;
  do {
    *(undefined4 *)(&uStack_40038 + lVar12) = uStack_40088;
    *(undefined4 *)((long)&uStack_40038 + lVar12 * 8 + 4) = uStack_40084;
    auStack_40030[lVar12 * 2] = uStack_40088;
    auStack_40030[lVar12 * 2 + 1] = uStack_40084;
    lVar12 = lVar12 + 2;
  } while (lVar12 != 0x4000);
  Convolution::convolve(&CStack_40078,(double *)&uStack_40038,0x4000);
  iVar8 = (int)src->size_;
  if (-0x2000 < iVar8) {
    uVar10 = 0;
    uVar13 = 0xffffe000;
    do {
      uVar7 = iVar8 - uVar10;
      uVar11 = 0x4000;
      if ((int)uVar7 < 0x4000) {
        uVar11 = uVar7;
      }
      uVar9 = 0;
      if (0 < (int)uVar11) {
        uVar9 = (ulong)uVar11;
      }
      if ((int)uVar7 < 1) {
LAB_00106ca6:
        memset(&uStack_40038 + uVar9,0,(ulong)(0x3fff - (int)uVar9) * 8 + 8);
      }
      else {
        uVar5 = (ulong)uVar11;
        if ((int)uVar11 < 2) {
          uVar5 = 1;
        }
        pSVar1 = src->data_;
        uVar6 = 0;
        do {
          (&uStack_40038)[uVar6] = pSVar1[uVar10 + uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
        if ((int)uVar7 < 0x4000) goto LAB_00106ca6;
      }
      Convolution::convolve(&CStack_40078,(double *)&uStack_40038,0x4000);
      pSVar1 = dst->data_;
      lVar12 = 0;
      do {
        iVar8 = (int)(uVar13 + lVar12);
        if ((-1 < iVar8) && (iVar8 < (int)src->size_)) {
          pSVar1[uVar13 + lVar12 & 0xffffffff] = (StkFloat)(&uStack_40038)[lVar12];
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x4000);
      uVar10 = uVar10 + (int)uVar9;
      iVar8 = (int)src->size_;
      uVar11 = (int)uVar13 + 0x4000;
      uVar13 = (ulong)uVar11;
    } while ((int)uVar11 < iVar8);
  }
  Convolution::~Convolution(&CStack_40078);
  return iVar8;
}

Assistant:

int firLowpassFilter(const stk::StkFrames &src,
					 stk::StkFrames &dst,
					 double stopband,
					 double initial_value)
{
	int		half_window_len = filter_window_len / 2;
	double	coeff[filter_window_len];
	double	input[filter_window_len];
	
	// フィルタ作成
	for (int i=0; i<filter_window_len; ++i) {
		double	x = i - half_window_len;
		double	window_x = x/half_window_len + 1.0;
		double	window = 0.54 - 0.46 * std::cos(M_PI * window_x);
		coeff[i] = sinc(x * stopband) * window * stopband;
	}
	
	Convolution conv(filter_window_len, coeff);

	// initial_valueの反映
	for (int i=0; i<filter_window_len; ++i) {
		input[i] = initial_value;
	}
	conv.convolve(input, filter_window_len);
	
	int src_index = 0;
	int dst_index = -half_window_len;
	
	while (dst_index < static_cast<int>(src.size())) {
		int input_len = static_cast<int>(src.size()) - src_index;
		if (input_len > filter_window_len) {
			input_len = filter_window_len;
		}
		if (input_len < 0) {
			input_len = 0;
		}
		for (int i=0; i<input_len; ++i) {
			input[i] = src[src_index + i];
		}
		for (int i=input_len; i<filter_window_len; ++i) {
			input[i] = 0;
		}
		conv.convolve(input, filter_window_len);
		src_index += input_len;
		
		for (int i=0; i<filter_window_len; ++i) {
			if ((dst_index >= 0) && (dst_index < static_cast<int>(src.size()))) {
				dst[dst_index] = input[i];
			}
			dst_index++;
		}
	}

	return (int)src.size();
}